

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O0

Ray * __thiscall phyr::Transform::operator()(Transform *this,Ray *r)

{
  long in_RDX;
  Ray *in_RDI;
  Vector3<double> *in_stack_00000020;
  Point3<double> *in_stack_00000028;
  Transform *in_stack_00000030;
  double factor;
  double lengthSq;
  double tMax;
  Vector3f d;
  Point3f o;
  Vector3f roError;
  Ray *this_00;
  Vector3<double> *in_stack_ffffffffffffff60;
  Vector3<double> *in_stack_ffffffffffffff68;
  Transform *in_stack_ffffffffffffff70;
  Vector3<double> local_88;
  double local_70;
  double local_68;
  double local_60;
  Vector3<double> local_58;
  Point3<double> local_40;
  Vector3<double> local_28;
  long local_10;
  
  this_00 = in_RDI;
  local_10 = in_RDX;
  Vector3<double>::Vector3(&local_28);
  operator()(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  operator()(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_60 = *(double *)(local_10 + 0x30);
  local_68 = Vector3<double>::lengthSquared(&local_58);
  if (0.0 < local_68) {
    abs<double>(in_stack_ffffffffffffff60);
    local_70 = dot<double>(&local_88,&local_28);
    local_70 = local_70 / local_68;
    Vector3<double>::operator*((Vector3<double> *)this_00,(double)in_RDI);
    Point3<double>::operator+=(&local_40,(Vector3<double> *)&stack0xffffffffffffff60);
    local_60 = local_60 - local_70;
  }
  Ray::Ray(in_RDI,&local_40,&local_58,local_60);
  return this_00;
}

Assistant:

inline Ray Transform::operator()(const Ray& r) const {
    Vector3f roError;

    // Transform ray origin and direction
    Point3f o = (*this)(r.o, &roError);
    Vector3f d = (*this)(r.d);

    Real tMax = r.tMax, lengthSq = d.lengthSquared();
    if (lengthSq > 0) {
        Real factor = dot(abs(d), roError) / lengthSq;
        o += d * factor; tMax -= factor;
    }

    return Ray(o, d, tMax);
}